

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O1

void run_WRAP(WorkerP *w,Task *__dq_head,TD_run *t)

{
  long lVar1;
  FILE *pFVar2;
  undefined8 uVar3;
  MTBDD MVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  MTBDD *pMVar9;
  ulong uVar10;
  long lVar11;
  MTBDD *pMVar12;
  double dVar13;
  double dVar14;
  MTBDD *apMStack_c0 [2];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_b0;
  _Worker *p_Stack_a8;
  MTBDD *pMStack_a0;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_98;
  MTBDD *pMStack_90;
  undefined1 auStack_88 [24];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_70;
  char acStack_68 [32];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_48;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_40;
  MTBDD *pMStack_38;
  
  apMStack_c0[0] = (MTBDD *)0x1035fe;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  uVar3 = auStack_88._0_8_;
  p_Stack_a8 = (_Worker *)auStack_88._8_8_;
  lVar1 = -(size * size * 8 + 0xf & 0xfffffffffffffff0);
  pMVar12 = (MTBDD *)((long)apMStack_c0 + lVar1 + 8);
  if (size != 0) {
    uVar6 = 0;
    pMVar9 = pMVar12;
    do {
      *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103640;
      MVar4 = mtbdd_ithvar((uint32_t)uVar6);
      *pMVar9 = MVar4;
      *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10364b;
      mtbdd_protect(pMVar9);
      uVar6 = uVar6 + 1;
      pMVar9 = pMVar9 + 1;
    } while (uVar6 < size * size);
  }
  p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
  p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10367f;
  mtbdd_protect((MTBDD *)&p_Stack_48);
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103687;
  mtbdd_protect((MTBDD *)&p_Stack_40);
  p_Stack_98 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103696;
  mtbdd_protect((MTBDD *)&p_Stack_98);
  if (size != 0) {
    uVar6 = 0;
    do {
      p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)pMVar12[uVar6];
      auStack_88._0_8_ = sylvan_and_WRAP;
      auStack_88._8_8_ = (_Worker *)0x1;
      auStack_88._16_8_ = p_Stack_98;
      acStack_68[0] = '\0';
      acStack_68[1] = '\0';
      acStack_68[2] = '\0';
      acStack_68[3] = '\0';
      *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1036dd;
      lace_run_task((Task *)auStack_88);
      p_Stack_98 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
      uVar6 = uVar6 + 1;
    } while (uVar6 < size * size);
  }
  pFVar2 = _stdout;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103713;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  dVar14 = (double)(long)auStack_88._0_8_;
  dVar13 = (double)(long)auStack_88._8_8_;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103743;
  fprintf(pFVar2,"[% 8.2f] Initialisation complete!\n",(dVar13 * 1e-06 + dVar14) - t_start);
  pFVar2 = _stdout;
  p_Stack_b0 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)uVar3;
  if (report_minor == '\0') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10378d;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Encoding rows...\n";
  }
  else {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103760;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Encoding rows... ";
  }
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1037c3;
  fprintf(pFVar2,pcVar7,dVar13 - t_start);
  pMStack_90 = pMVar12;
  if (size != 0) {
    lVar11 = 0;
    pMStack_38 = (MTBDD *)0x0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103805;
        printf("%zu... ");
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103814;
        fflush(_stdout);
      }
      if (size != 0) {
        uVar6 = 0;
        do {
          p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
          if (size != 0) {
            uVar8 = 0;
            do {
              if (uVar6 != uVar8) {
                p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                             (*(ulong *)((long)pMStack_90 + uVar8 * 8 + size * lVar11) ^
                             0x8000000000000000);
                auStack_88._0_8_ = sylvan_and_WRAP;
                auStack_88._8_8_ = (_Worker *)0x1;
                auStack_88._16_8_ = p_Stack_40;
                acStack_68[0] = '\0';
                acStack_68[1] = '\0';
                acStack_68[2] = '\0';
                acStack_68[3] = '\0';
                *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10388a;
                lace_run_task((Task *)auStack_88);
                p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < size);
          }
          auStack_88._16_8_ = (ulong)p_Stack_40 ^ 0x8000000000000000;
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       pMStack_90[size * (long)pMStack_38 + uVar6];
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1038e7;
          lace_run_task((Task *)auStack_88);
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       (auStack_88._16_8_ ^ 0x8000000000000000);
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          auStack_88._16_8_ = p_Stack_48;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          p_Stack_40 = p_Stack_70;
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103917;
          lace_run_task((Task *)auStack_88);
          p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
          uVar6 = uVar6 + 1;
        } while (uVar6 < size);
      }
      pMStack_38 = (MTBDD *)((long)pMStack_38 + 1);
      lVar11 = lVar11 + 8;
    } while (pMStack_38 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10395e;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103983;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_)
                          - t_start);
    auStack_88._0_8_ = sylvan_satcount_WRAP;
    auStack_88._8_8_ = (_Worker *)0x1;
    auStack_88._16_8_ = p_Stack_48;
    p_Stack_70 = p_Stack_98;
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1039e2;
    lace_run_task((Task *)auStack_88);
    pMVar12 = pMStack_38;
    uVar3 = auStack_88._16_8_;
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1039fe;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar12,uVar3);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103a1f;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Encoding columns... ";
  }
  else {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103a53;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Encoding columns...\n";
  }
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103a89;
  fprintf(pFVar2,pcVar7,dVar13 - t_start);
  if (size != 0) {
    pMStack_38 = (MTBDD *)0x0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103acb;
        printf("%zu... ");
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103ada;
        fflush(_stdout);
      }
      pMVar9 = pMStack_38;
      pMVar12 = pMStack_90;
      if (size != 0) {
        uVar6 = 0;
        do {
          p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
          if (size != 0) {
            uVar8 = 0;
            do {
              if (uVar6 != uVar8) {
                p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                             (pMVar12[(long)((long)pMVar9 + size * uVar8)] ^ 0x8000000000000000);
                auStack_88._0_8_ = sylvan_and_WRAP;
                auStack_88._8_8_ = (_Worker *)0x1;
                auStack_88._16_8_ = p_Stack_40;
                acStack_68[0] = '\0';
                acStack_68[1] = '\0';
                acStack_68[2] = '\0';
                acStack_68[3] = '\0';
                *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103b4d;
                lace_run_task((Task *)auStack_88);
                p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < size);
          }
          auStack_88._16_8_ = (ulong)p_Stack_40 ^ 0x8000000000000000;
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       pMVar12[(long)((long)pMVar9 + size * uVar6)];
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103b9e;
          lace_run_task((Task *)auStack_88);
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       (auStack_88._16_8_ ^ 0x8000000000000000);
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          auStack_88._16_8_ = p_Stack_48;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          p_Stack_40 = p_Stack_70;
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103bce;
          lace_run_task((Task *)auStack_88);
          p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
          uVar6 = uVar6 + 1;
        } while (uVar6 < size);
      }
      pMStack_38 = (MTBDD *)((long)pMStack_38 + 1);
    } while (pMStack_38 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103c11;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103c36;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_)
                          - t_start);
    auStack_88._0_8_ = sylvan_satcount_WRAP;
    auStack_88._8_8_ = (_Worker *)0x1;
    auStack_88._16_8_ = p_Stack_48;
    p_Stack_70 = p_Stack_98;
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103c95;
    lace_run_task((Task *)auStack_88);
    pMVar12 = pMStack_38;
    uVar3 = auStack_88._16_8_;
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103cb1;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar12,uVar3);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103cd2;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Encoding rising diagonals... ";
  }
  else {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103d06;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Encoding rising diagonals...\n";
  }
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103d3c;
  fprintf(pFVar2,pcVar7,dVar13 - t_start);
  if (size != 0) {
    pMStack_38 = pMStack_90;
    uVar6 = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103d7c;
        printf("%zu... ");
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103d8b;
        fflush(_stdout);
      }
      if (size != 0) {
        uVar8 = 0;
        pMVar12 = pMStack_38;
        do {
          p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
          if (size != 0) {
            lVar11 = 0;
            uVar10 = 0;
            do {
              if (((uVar6 != uVar10) && (uVar6 <= uVar10 + uVar8)) &&
                 (uVar10 + uVar8 < size + uVar6)) {
                p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                             (*(ulong *)((long)pMVar12 + uVar10 * 8 + size * lVar11) ^
                             0x8000000000000000);
                auStack_88._0_8_ = sylvan_and_WRAP;
                auStack_88._8_8_ = (_Worker *)0x1;
                auStack_88._16_8_ = p_Stack_40;
                acStack_68[0] = '\0';
                acStack_68[1] = '\0';
                acStack_68[2] = '\0';
                acStack_68[3] = '\0';
                *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103e13;
                lace_run_task((Task *)auStack_88);
                p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
              }
              uVar10 = uVar10 + 1;
              lVar11 = lVar11 + 8;
            } while (uVar10 < size);
          }
          auStack_88._16_8_ = (ulong)p_Stack_40 ^ 0x8000000000000000;
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       pMStack_90[size * uVar6 + uVar8];
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103e7b;
          lace_run_task((Task *)auStack_88);
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       (auStack_88._16_8_ ^ 0x8000000000000000);
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          auStack_88._16_8_ = p_Stack_48;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          p_Stack_40 = p_Stack_70;
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103eac;
          lace_run_task((Task *)auStack_88);
          p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
          uVar8 = uVar8 + 1;
          pMVar12 = pMVar12 + 1;
        } while (uVar8 < size);
      }
      uVar6 = uVar6 + 1;
      pMStack_38 = pMStack_38 + -1;
    } while (uVar6 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103ef0;
    putchar(10);
  }
  pMVar12 = pMStack_90;
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103f1c;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_)
                          - t_start);
    auStack_88._0_8_ = sylvan_satcount_WRAP;
    auStack_88._8_8_ = (_Worker *)0x1;
    auStack_88._16_8_ = p_Stack_48;
    p_Stack_70 = p_Stack_98;
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103f7b;
    lace_run_task((Task *)auStack_88);
    pMVar9 = pMStack_38;
    uVar3 = auStack_88._16_8_;
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103f97;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar9,uVar3);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103fb8;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Encoding falling diagonals... ";
  }
  else {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x103fec;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Encoding falling diagonals...\n";
  }
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104022;
  fprintf(pFVar2,pcVar7,dVar13 - t_start);
  if (size != 0) {
    pMStack_a0 = pMVar12;
    uVar6 = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10405e;
        printf("%zu... ");
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10406d;
        fflush(_stdout);
      }
      if (size != 0) {
        pMStack_38 = (MTBDD *)0x0;
        pMVar12 = pMStack_a0;
        do {
          p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
          apMStack_c0[1] = pMVar12;
          if (size != 0) {
            uVar8 = (long)pMStack_38 + uVar6;
            lVar11 = 0;
            uVar10 = 0;
            do {
              if (((uVar6 != uVar10) && (uVar10 <= uVar8)) && (uVar8 < size + uVar10)) {
                p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                             (*(ulong *)((long)pMVar12 + size * lVar11) ^ 0x8000000000000000);
                auStack_88._0_8_ = sylvan_and_WRAP;
                auStack_88._8_8_ = (_Worker *)0x1;
                auStack_88._16_8_ = p_Stack_40;
                acStack_68[0] = '\0';
                acStack_68[1] = '\0';
                acStack_68[2] = '\0';
                acStack_68[3] = '\0';
                *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10410b;
                lace_run_task((Task *)auStack_88);
                p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
              }
              uVar10 = uVar10 + 1;
              pMVar12 = pMVar12 + -1;
              lVar11 = lVar11 + 8;
            } while (uVar10 < size);
          }
          pMVar12 = pMStack_38;
          auStack_88._16_8_ = (ulong)p_Stack_40 ^ 0x8000000000000000;
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       pMStack_90[(long)(size * uVar6 + (long)pMStack_38)];
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10417e;
          lace_run_task((Task *)auStack_88);
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       (auStack_88._16_8_ ^ 0x8000000000000000);
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          auStack_88._16_8_ = p_Stack_48;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          p_Stack_40 = p_Stack_70;
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1041ae;
          lace_run_task((Task *)auStack_88);
          p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
          pMStack_38 = (MTBDD *)((long)pMVar12 + 1);
          pMVar12 = apMStack_c0[1] + 1;
        } while (pMStack_38 < size);
      }
      uVar6 = uVar6 + 1;
      pMStack_a0 = pMStack_a0 + 1;
    } while (uVar6 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104200;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104225;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_)
                          - t_start);
    auStack_88._0_8_ = sylvan_satcount_WRAP;
    auStack_88._8_8_ = (_Worker *)0x1;
    auStack_88._16_8_ = p_Stack_48;
    p_Stack_70 = p_Stack_98;
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104284;
    lace_run_task((Task *)auStack_88);
    pMVar12 = pMStack_38;
    uVar3 = auStack_88._16_8_;
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1042a0;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar12,uVar3);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1042c1;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Final computation to place a queen on every row... ";
  }
  else {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1042f5;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar13 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar7 = "[% 8.2f] Final computation to place a queen on every row...\n";
  }
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10432b;
  fprintf(pFVar2,pcVar7,dVar13 - t_start);
  if (size != 0) {
    lVar11 = 0;
    pMVar12 = (MTBDD *)0x0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104369;
        printf("%zu... ",pMVar12);
        *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104378;
        fflush(_stdout);
      }
      pMVar9 = pMStack_90;
      p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x0;
      pMStack_38 = pMVar12;
      if (size != 0) {
        uVar6 = 0;
        do {
          auStack_88._16_8_ = (ulong)p_Stack_40 ^ 0x8000000000000000;
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       (*(ulong *)((long)pMVar9 + uVar6 * 8 + size * lVar11) ^ 0x8000000000000000);
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1043f0;
          lace_run_task((Task *)auStack_88);
          p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       (auStack_88._16_8_ ^ 0x8000000000000000);
          uVar6 = uVar6 + 1;
        } while (uVar6 < size);
      }
      auStack_88._0_8_ = sylvan_and_WRAP;
      auStack_88._8_8_ = (_Worker *)0x1;
      auStack_88._16_8_ = p_Stack_48;
      p_Stack_70 = p_Stack_40;
      acStack_68[0] = '\0';
      acStack_68[1] = '\0';
      acStack_68[2] = '\0';
      acStack_68[3] = '\0';
      *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10444e;
      lace_run_task((Task *)auStack_88);
      p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
      pMVar12 = (MTBDD *)((long)pMStack_38 + 1);
      lVar11 = lVar11 + 8;
    } while (pMVar12 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104484;
    putchar(10);
  }
  pMStack_90 = (MTBDD *)((double)(long)p_Stack_a8 * 1e-06 + (double)(long)p_Stack_b0);
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1044be;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  pFVar2 = _stdout;
  pMStack_90 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_) -
                        (double)pMStack_90);
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104504;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  sVar5 = size;
  pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_) -
                        t_start);
  auStack_88._0_8_ = sylvan_satcount_WRAP;
  auStack_88._8_8_ = (_Worker *)0x1;
  auStack_88._16_8_ = p_Stack_48;
  p_Stack_70 = p_Stack_98;
  acStack_68[0] = '\0';
  acStack_68[1] = '\0';
  acStack_68[2] = '\0';
  acStack_68[3] = '\0';
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10456a;
  lace_run_task((Task *)auStack_88);
  pMVar12 = pMStack_38;
  uVar3 = auStack_88._16_8_;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104589;
  fprintf(pFVar2,"[% 8.2f] Result: NQueens(%zu) has %.0f solutions.\n",pMVar12,uVar3,sVar5);
  pFVar2 = _stdout;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x104597;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_) -
                        t_start);
  auStack_88._0_8_ = p_Stack_48;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1045d6;
  sVar5 = mtbdd_nodecount_more((MTBDD *)auStack_88,1);
  pMVar12 = pMStack_38;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1045ef;
  fprintf(pFVar2,"[% 8.2f] Result BDD has %zu nodes.\n",pMVar12,sVar5);
  pFVar2 = _stdout;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x1045fd;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  pMVar12 = pMStack_90;
  dVar14 = (double)(long)auStack_88._0_8_;
  dVar13 = (double)(long)auStack_88._8_8_;
  *(undefined8 *)((long)apMStack_c0 + lVar1) = 0x10463b;
  fprintf(pFVar2,"[% 8.2f] Computation time: %f sec.\n",(dVar13 * 1e-06 + dVar14) - t_start,pMVar12)
  ;
  return;
}

Assistant:

VOID_TASK_0(run)
{
    double t1 = wctime();

    BDD zero = sylvan_false;
    BDD one = sylvan_true;

    // Variables 0 ... (SIZE*SIZE-1)

    BDD board[size*size];
    for (size_t i=0; i<size*size; i++) {
        board[i] = sylvan_ithvar(i);
        sylvan_protect(board+i);
    }

    BDD res = one, temp = one;

    // we use sylvan's "protect" marking mechanism...
    // that means we hardly need to do manual ref/deref when the variables change
    sylvan_protect(&res);
    sylvan_protect(&temp);

    // Old satcount function still requires a silly variables cube
    BDD vars = one;
    sylvan_protect(&vars);
    for (size_t i=0; i<size*size; i++) vars = sylvan_and(vars, board[i]);

    INFO("Initialisation complete!\n");

    if (report_minor) {
        INFO("Encoding rows... ");
    } else {
        INFO("Encoding rows...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            // compute "\BigAnd (!board[i][k]) \or !board[i][j]" with k != j
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (j==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[i*size+k]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding columns... ");
    } else {
        INFO("Encoding columns...\n");
    }

    for (size_t j=0; j<size; j++) {
        if (report_minor) {
            printf("%zu... ", j);
            fflush(stdout);
        }

        for (size_t i=0; i<size; i++) {
            // compute "\BigAnd (!board[k][j]) \or !board[i][j]" with k != i
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (i==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[k*size+j]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding rising diagonals... ");
    } else {
        INFO("Encoding rising diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+k-i >= 0 && j+k-i < size && k != i)
                if (j+k >= i && j+k < size+i && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+k-i)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding falling diagonals... ");
    } else {
        INFO("Encoding falling diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+i-k >= 0 && j+i-k < size && k != i)
                if (j+i >= k && j+i < size+k && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+i-k)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size + j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Final computation to place a queen on every row... ");
    } else {
        INFO("Final computation to place a queen on every row...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        temp = zero;
        for (size_t j=0; j<size; j++) {
            temp = sylvan_or(temp, board[i*size+j]);
        }
        res = sylvan_and(res, temp);
    }

    if (report_minor) {
        printf("\n");
    }

    double t2 = wctime();

    INFO("Result: NQueens(%zu) has %.0f solutions.\n", size, sylvan_satcount(res, vars));
    INFO("Result BDD has %zu nodes.\n", sylvan_nodecount(res));
    INFO("Computation time: %f sec.\n", t2-t1);
}